

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O1

void __thiscall glslang::TPpContext::tMacroInput::~tMacroInput(tMacroInput *this)

{
  pointer ppTVar1;
  ulong uVar2;
  
  (this->super_tInput)._vptr_tInput = (_func_int **)&PTR__tMacroInput_00b12a88;
  ppTVar1 = (this->args).
            super_vector<glslang::TPpContext::TokenStream_*,_glslang::pool_allocator<glslang::TPpContext::TokenStream_*>_>
            .
            super__Vector_base<glslang::TPpContext::TokenStream_*,_glslang::pool_allocator<glslang::TPpContext::TokenStream_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->args).
      super_vector<glslang::TPpContext::TokenStream_*,_glslang::pool_allocator<glslang::TPpContext::TokenStream_*>_>
      .
      super__Vector_base<glslang::TPpContext::TokenStream_*,_glslang::pool_allocator<glslang::TPpContext::TokenStream_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppTVar1) {
    uVar2 = 0;
    do {
      if (ppTVar1[uVar2] != (TokenStream *)0x0) {
        operator_delete(ppTVar1[uVar2],0x28);
      }
      uVar2 = uVar2 + 1;
      ppTVar1 = (this->args).
                super_vector<glslang::TPpContext::TokenStream_*,_glslang::pool_allocator<glslang::TPpContext::TokenStream_*>_>
                .
                super__Vector_base<glslang::TPpContext::TokenStream_*,_glslang::pool_allocator<glslang::TPpContext::TokenStream_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->args).
                                   super_vector<glslang::TPpContext::TokenStream_*,_glslang::pool_allocator<glslang::TPpContext::TokenStream_*>_>
                                   .
                                   super__Vector_base<glslang::TPpContext::TokenStream_*,_glslang::pool_allocator<glslang::TPpContext::TokenStream_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3))
    ;
  }
  ppTVar1 = (this->expandedArgs).
            super_vector<glslang::TPpContext::TokenStream_*,_glslang::pool_allocator<glslang::TPpContext::TokenStream_*>_>
            .
            super__Vector_base<glslang::TPpContext::TokenStream_*,_glslang::pool_allocator<glslang::TPpContext::TokenStream_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->expandedArgs).
      super_vector<glslang::TPpContext::TokenStream_*,_glslang::pool_allocator<glslang::TPpContext::TokenStream_*>_>
      .
      super__Vector_base<glslang::TPpContext::TokenStream_*,_glslang::pool_allocator<glslang::TPpContext::TokenStream_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppTVar1) {
    uVar2 = 0;
    do {
      if (ppTVar1[uVar2] != (TokenStream *)0x0) {
        operator_delete(ppTVar1[uVar2],0x28);
      }
      uVar2 = uVar2 + 1;
      ppTVar1 = (this->expandedArgs).
                super_vector<glslang::TPpContext::TokenStream_*,_glslang::pool_allocator<glslang::TPpContext::TokenStream_*>_>
                .
                super__Vector_base<glslang::TPpContext::TokenStream_*,_glslang::pool_allocator<glslang::TPpContext::TokenStream_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->expandedArgs).
                                   super_vector<glslang::TPpContext::TokenStream_*,_glslang::pool_allocator<glslang::TPpContext::TokenStream_*>_>
                                   .
                                   super__Vector_base<glslang::TPpContext::TokenStream_*,_glslang::pool_allocator<glslang::TPpContext::TokenStream_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3))
    ;
  }
  return;
}

Assistant:

virtual ~tMacroInput()
        {
            for (size_t i = 0; i < args.size(); ++i)
                delete args[i];
            for (size_t i = 0; i < expandedArgs.size(); ++i)
                delete expandedArgs[i];
        }